

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<kj::Maybe<kj::_::(anonymous_namespace)::Stringable>&>
          (String *__return_storage_ptr__,kj *this,
          Maybe<kj::_::(anonymous_namespace)::Stringable> *params)

{
  char *pcVar1;
  String result;
  String local_28;
  
  if (((ulong)this & 1) == 0) {
    str<char_const(&)[7]>(&local_28,(kj *)"(none)",(char (*) [7])params);
  }
  else {
    heapString(&local_28,3);
    pcVar1 = (char *)local_28.content.size_;
    if ((char *)local_28.content.size_ != (char *)0x0) {
      pcVar1 = local_28.content.ptr;
    }
    pcVar1[2] = 'o';
    pcVar1[0] = 'f';
    pcVar1[1] = 'o';
  }
  (__return_storage_ptr__->content).ptr = local_28.content.ptr;
  (__return_storage_ptr__->content).size_ = local_28.content.size_;
  (__return_storage_ptr__->content).disposer = local_28.content.disposer;
  return (String *)local_28.content.disposer;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}